

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

void __thiscall
slang::ast::PackedArrayType::serializeTo(PackedArrayType *this,ASTSerializer *serializer)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  string local_58;
  int32_t local_38 [4];
  int32_t local_28;
  
  ASTSerializer::write(serializer,0xb,"elementType",(size_t)this->elementType);
  local_38[0] = (this->range).left;
  local_28 = (this->range).right;
  fmt.size_ = 0x11;
  fmt.data_ = (char *)0x7;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_38;
  ::fmt::v11::vformat_abi_cxx11_(&local_58,(v11 *)0x49529e,fmt,args);
  ASTSerializer::write(serializer,5,"range",(size_t)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PackedArrayType::serializeTo(ASTSerializer& serializer) const {
    serializer.write("elementType", elementType);
    serializer.write("range", fmt::format("[{}:{}]", range.left, range.right));
}